

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::forcingColumn<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,HighsMatrixSlice<HighsTripletListSlice> *colVec,
          double cost,double boundVal,bool atInfiniteUpper,bool colIntegral)

{
  pointer pNVar1;
  HighsInt *pHVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ForcingColumn local_48;
  
  pNVar1 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  lVar6 = (long)colVec->head;
  pdVar4 = (double *)(colVec->nodeIndex + lVar6);
  if (lVar6 == -1) {
    pdVar4 = (double *)0x0;
  }
  pHVar2 = colVec->nodeNext;
  pdVar5 = colVec->nodeValue + lVar6;
  if (lVar6 == -1) {
    pdVar5 = (double *)0x0;
  }
  while ((int)lVar6 != -1) {
    local_48.colCost = *pdVar5;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->colValues,
               (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *(int *)pdVar4,&local_48.colCost);
    lVar3 = (long)(int)lVar6;
    lVar6 = (long)pHVar2[lVar3];
    pdVar4 = (double *)((long)pdVar4 + lVar6 * 4 + lVar3 * -4);
    pdVar5 = pdVar5 + (lVar6 - lVar3);
  }
  local_48.col = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  local_48.colCost = cost;
  local_48.colBound = boundVal;
  local_48.atInfiniteUpper = atInfiniteUpper;
  local_48.colIntegral = colIntegral;
  HighsDataStack::push<presolve::HighsPostsolveStack::ForcingColumn,_0>
            (&this->reductionValues,&local_48);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  reductionAdded(this,kForcingColumn);
  return;
}

Assistant:

void forcingColumn(HighsInt col,
                     const HighsMatrixSlice<ColStorageFormat>& colVec,
                     double cost, double boundVal, bool atInfiniteUpper,
                     bool colIntegral) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(ForcingColumn{cost, boundVal, origColIndex[col],
                                       atInfiniteUpper, colIntegral});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kForcingColumn);
  }